

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

uoffset_t __thiscall flatbuffers::Parser::ParseVector(Parser *this,Type *type)

{
  FlatBufferBuilder *this_00;
  pointer ppVar1;
  StructDef *struct_def;
  pointer pFVar2;
  double element;
  uchar element_00;
  char element_01;
  short element_02;
  unsigned_short element_03;
  Offset<void> off;
  int element_04;
  uint element_05;
  uoffset_t uVar3;
  size_t sVar4;
  size_t elemsize;
  int64_t element_06;
  unsigned_long element_07;
  uint uVar5;
  uint element_08;
  bool bVar6;
  float element_09;
  Value val;
  undefined1 local_c0 [64];
  void *local_80;
  undefined1 local_78 [72];
  
  element_08 = 0;
  if (this->token_ != 0x5d) {
    element_08 = 1;
    while( true ) {
      Value::Value(&val);
      val.type.enum_def = type->enum_def;
      val.type.base_type = type->base_type;
      val.type.element = type->element;
      val.type.struct_def = type->struct_def;
      ParseAnyValue(this,&val,(FieldDef *)0x0);
      Value::Value((Value *)local_c0,&val);
      local_80 = (void *)0x0;
      std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>::
      pair<flatbuffers::Value,_std::nullptr_t,_true>
                ((pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)local_78,
                 (pair<flatbuffers::Value,_std::nullptr_t> *)local_c0);
      std::
      vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
      ::emplace_back<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>
                ((vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
                  *)&this->field_stack_,
                 (pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)local_78);
      std::__cxx11::string::~string((string *)(local_78 + 0x18));
      std::__cxx11::string::~string((string *)(local_c0 + 0x18));
      if (this->token_ == 0x5d) break;
      Expect(this,0x2c);
      std::__cxx11::string::~string((string *)&val.constant);
      element_08 = element_08 + 1;
    }
    std::__cxx11::string::~string((string *)&val.constant);
  }
  Next(this);
  this_00 = &this->builder_;
  sVar4 = InlineSize(type);
  elemsize = InlineAlignment(type);
  FlatBufferBuilder::StartVector(this_00,(long)(int)element_08 * sVar4,elemsize);
  uVar5 = element_08;
  do {
    bVar6 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    if (bVar6) {
      pFVar2 = (this->builder_).offsetbuf_.
               super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->builder_).offsetbuf_.
          super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
          ._M_impl.super__Vector_impl_data._M_finish != pFVar2) {
        (this->builder_).offsetbuf_.
        super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
        ._M_impl.super__Vector_impl_data._M_finish = pFVar2;
      }
      uVar3 = FlatBufferBuilder::PushElement<unsigned_int>(this_00,element_08);
      return uVar3;
    }
    ppVar1 = (this->field_stack_).
             super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    switch(ppVar1[-1].first.type.base_type) {
    case BASE_TYPE_NONE:
    case BASE_TYPE_UTYPE:
    case BASE_TYPE_BOOL:
    case BASE_TYPE_UCHAR:
      element_00 = atot<unsigned_char>(ppVar1[-1].first.constant._M_dataplus._M_p);
      FlatBufferBuilder::PushElement<unsigned_char>(this_00,element_00);
      break;
    case BASE_TYPE_CHAR:
      element_01 = atot<signed_char>(ppVar1[-1].first.constant._M_dataplus._M_p);
      FlatBufferBuilder::PushElement<signed_char>(this_00,element_01);
      break;
    case BASE_TYPE_SHORT:
      element_02 = atot<short>(ppVar1[-1].first.constant._M_dataplus._M_p);
      FlatBufferBuilder::PushElement<short>(this_00,element_02);
      break;
    case BASE_TYPE_USHORT:
      element_03 = atot<unsigned_short>(ppVar1[-1].first.constant._M_dataplus._M_p);
      FlatBufferBuilder::PushElement<unsigned_short>(this_00,element_03);
      break;
    case BASE_TYPE_INT:
      element_04 = atot<int>(ppVar1[-1].first.constant._M_dataplus._M_p);
      FlatBufferBuilder::PushElement<int>(this_00,element_04);
      break;
    case BASE_TYPE_UINT:
      element_05 = atot<unsigned_int>(ppVar1[-1].first.constant._M_dataplus._M_p);
      FlatBufferBuilder::PushElement<unsigned_int>(this_00,element_05);
      break;
    case BASE_TYPE_LONG:
      element_06 = StringToInt(ppVar1[-1].first.constant._M_dataplus._M_p);
      FlatBufferBuilder::PushElement<long>(this_00,element_06);
      break;
    case BASE_TYPE_ULONG:
      element_07 = StringToInt(ppVar1[-1].first.constant._M_dataplus._M_p);
      FlatBufferBuilder::PushElement<unsigned_long>(this_00,element_07);
      break;
    case BASE_TYPE_FLOAT:
      element_09 = atot<float>(ppVar1[-1].first.constant._M_dataplus._M_p);
      FlatBufferBuilder::PushElement<float>(this_00,element_09);
      break;
    case BASE_TYPE_DOUBLE:
      element = atot<double>(ppVar1[-1].first.constant._M_dataplus._M_p);
      FlatBufferBuilder::PushElement<double>(this_00,element);
      break;
    case BASE_TYPE_STRING:
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_UNION:
switchD_0011112a_caseD_d:
      off.o = atoi(ppVar1[-1].first.constant._M_dataplus._M_p);
      FlatBufferBuilder::PushElement<void>(this_00,off);
      break;
    case BASE_TYPE_STRUCT:
      struct_def = ppVar1[-1].first.type.struct_def;
      if (struct_def->fixed != true) goto switchD_0011112a_caseD_d;
      SerializeStruct(this,struct_def,&ppVar1[-1].first);
    }
    std::
    vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
    ::pop_back(&this->field_stack_);
  } while( true );
}

Assistant:

uoffset_t Parser::ParseVector(const Type &type) {
  int count = 0;
  if (token_ != ']') for (;;) {
    Value val;
    val.type = type;
    ParseAnyValue(val, NULL);
    field_stack_.push_back(std::make_pair(val, nullptr));
    count++;
    if (token_ == ']') break;
    Expect(',');
  }
  Next();

  builder_.StartVector(count * InlineSize(type), InlineAlignment((type)));
  for (int i = 0; i < count; i++) {
    // start at the back, since we're building the data backwards.
    auto &val = field_stack_.back().first;
    switch (val.type.base_type) {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
        case BASE_TYPE_ ## ENUM: \
          if (IsStruct(val.type)) SerializeStruct(*val.type.struct_def, val); \
          else builder_.PushElement(atot<CTYPE>(val.constant.c_str())); \
          break;
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
    }
    field_stack_.pop_back();
  }

  builder_.ClearOffsets();
  return builder_.EndVector(count);
}